

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O1

void __thiscall
QDirListingPrivate::checkAndPushDirectory(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  bool bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QStringView fileName;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
          super_QFlagsStorage<QDirListing::IteratorFlag>.i;
  if ((uVar2 >> 10 & 1) != 0) {
    if ((uVar2 >> 0xb & 1) == 0) {
      bVar1 = QDirEntryInfo::isSymLink(entryInfo);
      if (bVar1) goto LAB_00230e0b;
    }
    QDirEntryInfo::fileName(&local_40,entryInfo);
    fileName.m_data = local_40.d.ptr;
    fileName.m_size = local_40.d.size;
    bVar1 = isDotOrDotDot(fileName);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!bVar1) {
      uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
              super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x40;
      if (this->useLegacyFilters != false) {
        uVar2 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                super_QFlagsStorage<QDir::Filter>.i & 0x500;
      }
      if (uVar2 == 0) {
        bVar1 = QDirEntryInfo::isHidden(entryInfo);
        if (bVar1) goto LAB_00230e0b;
      }
      bVar1 = QDirEntryInfo::isDir(entryInfo);
      if (bVar1) {
        pushDirectory(this,entryInfo);
      }
    }
  }
LAB_00230e0b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::checkAndPushDirectory(QDirEntryInfo &entryInfo)
{
    using F = QDirListing::IteratorFlag;
    // If we're doing flat iteration, we're done.
    if (!iteratorFlags.testAnyFlags(F::Recursive))
        return;

    // Follow symlinks only when asked
    if (!iteratorFlags.testAnyFlags(F::FollowDirSymlinks) && entryInfo.isSymLink())
        return;

    // Never follow . and ..
    if (isDotOrDotDot(entryInfo.fileName()))
        return;

    // No hidden directories unless requested
    const bool includeHidden = [this]() {
        if (useLegacyFilters)
            return legacyDirFilters.testAnyFlags(QDir::AllDirs | QDir::Hidden);
        return iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::IncludeHidden);
    }();
    if (!includeHidden && entryInfo.isHidden())
        return;

    // Never follow non-directory entries
    if (!entryInfo.isDir())
        return;

    pushDirectory(entryInfo);
}